

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidload.c
# Opt level: O1

FT_Error parse_expansion_factor(CID_Face face,CID_Parser *parser)

{
  CID_FaceDict pCVar1;
  FT_Fixed FVar2;
  long lVar3;
  
  lVar3 = (long)parser->num_dict;
  if ((-1 < lVar3) && (parser->num_dict < (face->cid).num_dicts)) {
    pCVar1 = (face->cid).font_dicts;
    FVar2 = (*(parser->root).funcs.to_fixed)(&parser->root,0);
    pCVar1[lVar3].expansion_factor = FVar2;
    pCVar1[lVar3].private_dict.expansion_factor = FVar2;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  parse_expansion_factor( CID_Face     face,
                          CID_Parser*  parser )
  {
    CID_FaceDict  dict;


    if ( parser->num_dict >= 0 && parser->num_dict < face->cid.num_dicts )
    {
      dict = face->cid.font_dicts + parser->num_dict;

      dict->expansion_factor              = cid_parser_to_fixed( parser, 0 );
      dict->private_dict.expansion_factor = dict->expansion_factor;
    }

    return FT_Err_Ok;
  }